

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  cmTargetInternals *pcVar5;
  allocator local_901;
  value_type local_900;
  undefined1 local_8e0 [8];
  cmListFileBacktrace lfbt_5;
  ostringstream local_880 [8];
  ostringstream e_3;
  allocator local_701;
  value_type local_700;
  undefined1 local_6e0 [8];
  cmListFileBacktrace lfbt_4;
  ostringstream local_680 [8];
  ostringstream e_2;
  undefined1 local_508 [8];
  cmListFileBacktrace lfbt_3;
  value_type local_4c0;
  undefined1 local_4a0 [8];
  cmListFileBacktrace lfbt_2;
  value_type local_458;
  undefined1 local_438 [8];
  cmListFileBacktrace lfbt_1;
  value_type local_3f0;
  undefined1 local_3d0 [8];
  cmListFileBacktrace lfbt;
  value_type local_388;
  string local_368;
  ostringstream local_348 [8];
  ostringstream e_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  TVar3 = GetType(this);
  if ((TVar3 != INTERFACE_LIBRARY) || (bVar2 = whiteListedInterfaceProperty(prop), bVar2)) {
    bVar2 = std::operator==(prop,"NAME");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_348);
      std::operator<<((ostream *)local_348,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_368,false);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::ostringstream::~ostringstream(local_348);
    }
    else {
      bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar2) {
        if ((value != (char *)0x0) && (*value != '\0')) {
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_388,value,
                     (allocator *)((long)&lfbt.Snapshot.Position.Position + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pcVar5->IncludeDirectoriesEntries,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&lfbt.Snapshot.Position.Position + 7));
          cmMakefile::GetBacktrace((cmListFileBacktrace *)local_3d0,this->Makefile);
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                    (&pcVar5->IncludeDirectoriesBacktraces,(value_type *)local_3d0);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_3d0);
        }
      }
      else {
        bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar2) {
          if ((value != (char *)0x0) && (*value != '\0')) {
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_3f0,value,
                       (allocator *)((long)&lfbt_1.Snapshot.Position.Position + 7));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&pcVar5->CompileOptionsEntries,&local_3f0);
            std::__cxx11::string::~string((string *)&local_3f0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)&lfbt_1.Snapshot.Position.Position + 7));
            cmMakefile::GetBacktrace((cmListFileBacktrace *)local_438,this->Makefile);
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                      (&pcVar5->CompileOptionsBacktraces,(value_type *)local_438);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_438);
          }
        }
        else {
          bVar2 = std::operator==(prop,"COMPILE_FEATURES");
          if (bVar2) {
            if ((value != (char *)0x0) && (*value != '\0')) {
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_458,value,
                         (allocator *)((long)&lfbt_2.Snapshot.Position.Position + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&pcVar5->CompileFeaturesEntries,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)&lfbt_2.Snapshot.Position.Position + 7));
              cmMakefile::GetBacktrace((cmListFileBacktrace *)local_4a0,this->Makefile);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                        (&pcVar5->CompileFeaturesBacktraces,(value_type *)local_4a0);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_4a0);
            }
          }
          else {
            bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
            if (bVar2) {
              if ((value != (char *)0x0) && (*value != '\0')) {
                pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_4c0,value,
                           (allocator *)((long)&lfbt_3.Snapshot.Position.Position + 7));
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar5->CompileDefinitionsEntries,&local_4c0);
                std::__cxx11::string::~string((string *)&local_4c0);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&lfbt_3.Snapshot.Position.Position + 7));
                cmMakefile::GetBacktrace((cmListFileBacktrace *)local_508,this->Makefile);
                pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&pcVar5->CompileDefinitionsBacktraces,(value_type *)local_508);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_508);
              }
            }
            else {
              bVar2 = std::operator==(prop,"EXPORT_NAME");
              if ((bVar2) && (bVar2 = IsImported(this), bVar2)) {
                std::__cxx11::ostringstream::ostringstream(local_680);
                poVar4 = std::operator<<((ostream *)local_680,
                                         "EXPORT_NAME property can\'t be set on imported targets (\""
                                        );
                poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                std::operator<<(poVar4,"\")\n");
                pcVar1 = this->Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage
                          (pcVar1,FATAL_ERROR,(string *)&lfbt_4.Snapshot.Position.Position,false);
                std::__cxx11::string::~string((string *)&lfbt_4.Snapshot.Position.Position);
                std::__cxx11::ostringstream::~ostringstream(local_680);
              }
              else {
                bVar2 = std::operator==(prop,"LINK_LIBRARIES");
                if (bVar2) {
                  if ((value != (char *)0x0) && (*value != '\0')) {
                    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_6e0,this->Makefile);
                    pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_700,value,&local_701);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&pcVar5->LinkImplementationPropertyEntries,&local_700);
                    std::__cxx11::string::~string((string *)&local_700);
                    std::allocator<char>::~allocator((allocator<char> *)&local_701);
                    pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar5->LinkImplementationPropertyBacktraces,(value_type *)local_6e0)
                    ;
                    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_6e0);
                  }
                }
                else {
                  bVar2 = std::operator==(prop,"SOURCES");
                  if (bVar2) {
                    bVar2 = IsImported(this);
                    if (bVar2) {
                      std::__cxx11::ostringstream::ostringstream(local_880);
                      poVar4 = std::operator<<((ostream *)local_880,
                                               "SOURCES property can\'t be set on imported targets (\""
                                              );
                      poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                      std::operator<<(poVar4,"\")\n");
                      pcVar1 = this->Makefile;
                      std::__cxx11::ostringstream::str();
                      cmMakefile::IssueMessage
                                (pcVar1,FATAL_ERROR,(string *)&lfbt_5.Snapshot.Position.Position,
                                 false);
                      std::__cxx11::string::~string((string *)&lfbt_5.Snapshot.Position.Position);
                      std::__cxx11::ostringstream::~ostringstream(local_880);
                    }
                    else {
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_8e0,this->Makefile);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_900,value,&local_901);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&pcVar5->SourceEntries,&local_900);
                      std::__cxx11::string::~string((string *)&local_900);
                      std::allocator<char>::~allocator((allocator<char> *)&local_901);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar5->SourceBacktraces,(value_type *)local_8e0);
                      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_8e0);
                    }
                  }
                  else {
                    cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar4 = std::operator<<((ostream *)local_1a0,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)prop);
    std::operator<<(poVar4,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1d0,false);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    if (value && *value)
      {
      this->Internal->IncludeDirectoriesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->IncludeDirectoriesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    if (value && *value)
      {
      this->Internal->CompileOptionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileOptionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_FEATURES")
    {
    if (value && *value)
      {
      this->Internal->CompileFeaturesEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileFeaturesBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    if (value && *value)
      {
      this->Internal->CompileDefinitionsEntries.push_back(value);
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->CompileDefinitionsBacktraces.push_back(lfbt);
      }
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    if (value && *value)
      {
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      this->Internal->LinkImplementationPropertyEntries.push_back(value);
      this->Internal->LinkImplementationPropertyBacktraces.push_back(lfbt);
      }
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    this->Internal->SourceEntries.push_back(value);
    this->Internal->SourceBacktraces.push_back(lfbt);
    }
  else
    {
    this->Properties.AppendProperty(prop, value, asString);
    }
}